

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string.h
# Opt level: O0

char * __thiscall google::protobuf::internal::MicroString::LargeRep::owned_head(LargeRep *this)

{
  LargeRepKind *v2;
  char *failure_msg;
  LogMessage *pLVar1;
  LogMessage local_38;
  Voidify local_21;
  LargeRepKind local_20;
  uint local_1c;
  Nullable<const_char_*> local_18;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  LargeRep *this_local;
  
  absl_log_internal_check_op_result = (Nullable<const_char_*>)this;
  local_1c = absl::lts_20250127::log_internal::GetReferenceableValue(this->capacity);
  local_20 = kOwned;
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::internal::MicroString::LargeRepKind>(&local_20);
  local_18 = absl::lts_20250127::log_internal::
             Check_GEImpl<unsigned_int,google::protobuf::internal::MicroString::LargeRepKind>
                       (&local_1c,v2,"capacity >= kOwned");
  if (local_18 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_18);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string.h"
               ,0x4d,failure_msg);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_38);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_21,pLVar1);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_38);
  }
  return (char *)(this + 1);
}

Assistant:

char* owned_head() {
      ABSL_DCHECK_GE(capacity, kOwned);
      return reinterpret_cast<char*>(this + 1);
    }